

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyInsertNodeAtEnd(Node *element,Node *node)

{
  Node *node_local;
  Node *element_local;
  
  node->parent = element;
  node->prev = element->last;
  if (element->last == (Node *)0x0) {
    element->content = node;
  }
  else {
    element->last->next = node;
  }
  element->last = node;
  return;
}

Assistant:

void TY_(InsertNodeAtEnd)(Node *element, Node *node)
{
    node->parent = element;
    node->prev = element->last;

    if (element->last != NULL)
        element->last->next = node;
    else
        element->content = node;

    element->last = node;
}